

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_impl.hpp
# Opt level: O2

void __thiscall
boost::detail::sp_counted_impl_p<boost::runtime::cla::rt_cla_detail::parameter_trie>::dispose
          (sp_counted_impl_p<boost::runtime::cla::rt_cla_detail::parameter_trie> *this)

{
  checked_delete<boost::runtime::cla::rt_cla_detail::parameter_trie>(this->px_);
  return;
}

Assistant:

virtual void dispose() // nothrow
    {
#if defined(BOOST_SP_ENABLE_DEBUG_HOOKS)
        boost::sp_scalar_destructor_hook( px_, sizeof(X), this );
#endif
        boost::checked_delete( px_ );
    }